

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_manager.h
# Opt level: O0

void __thiscall
miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::
TimerQueueCallback::~TimerQueueCallback(TimerQueueCallback *this)

{
  bool bVar1;
  element_type *peVar2;
  mutex_type *in_RDI;
  scoped_lock<std::mutex> lock;
  TimerInfoPtr info;
  scoped_lock<std::mutex> *in_stack_ffffffffffffffe0;
  weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
  *in_stack_ffffffffffffffe8;
  
  (in_RDI->super___mutex_base)._M_mutex.__align = (long)&PTR__TimerQueueCallback_0061f910;
  std::
  weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
  ::lock(in_stack_ffffffffffffffe8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    std::
    __shared_ptr_access<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4c8d88);
    std::scoped_lock<std::mutex>::scoped_lock(in_stack_ffffffffffffffe0,in_RDI);
    peVar2 = std::
             __shared_ptr_access<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4c8da5);
    peVar2->waiting_callbacks = peVar2->waiting_callbacks - 1;
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4c8dbe);
  }
  std::
  shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
  ::~shared_ptr((shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
                 *)0x4c8dc8);
  std::
  weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
  ::~weak_ptr((weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
               *)0x4c8dd5);
  CallbackInterface::~CallbackInterface((CallbackInterface *)in_RDI);
  return;
}

Assistant:

~TimerQueueCallback()
    {
      TimerInfoPtr info = info_.lock();
      if (info)
      {
        std::scoped_lock<std::mutex> lock(info->waiting_mutex);
        --info->waiting_callbacks;
      }
    }